

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_dstore(ExecutionEngine *this)

{
  uint32_t index;
  u2 uVar1;
  u4 uVar2;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar3;
  anon_union_8_10_52016fac_for_data extraout_RDX;
  ushort uVar4;
  Value VVar5;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar5 = Frame::popTopOfOperandStack(this_01);
  if (VVar5.type != DOUBLE) {
    __assert_fail("value.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x4d5,"void ExecutionEngine::i_dstore()");
  }
  Frame::popTopOfOperandStack(this_01);
  puVar3 = Frame::getCode(this_01,this_01->pc);
  uVar4 = (ushort)puVar3[1];
  if (this->_isWide == true) {
    uVar4 = CONCAT11(puVar3[1],puVar3[2]);
    uVar2 = this_01->pc + 3;
    this->_isWide = false;
  }
  else {
    uVar2 = this_01->pc + 2;
  }
  this_01->pc = uVar2;
  uVar1 = Frame::sizeLocalVariables(this_01);
  index = (int)(short)uVar4 + 1;
  if ((int)index < (int)(short)uVar1) {
    Frame::changeLocalVariable(this_01,VVar5,(int)(short)uVar4);
    VVar5.data.longValue = extraout_RDX.longValue;
    VVar5.printType = BOOLEAN;
    VVar5.type = PADDING;
    Frame::changeLocalVariable(this_01,VVar5,index);
    return;
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > (index + 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x4e5,"void ExecutionEngine::i_dstore()");
}

Assistant:

void ExecutionEngine::i_dstore() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value = topFrame->popTopOfOperandStack();
	assert(value.type == ValueType::DOUBLE);
	topFrame->popTopOfOperandStack(); //padding

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	} else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > (index + 1)));
	topFrame->changeLocalVariable(value, index);
	Value padding;
	padding.type = ValueType::PADDING;
	topFrame->changeLocalVariable(padding, index + 1);
}